

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O3

HRESULT ChakraRTInterface::ParseConfigFlags(void)

{
  size_t sourceString;
  HRESULT HVar1;
  size_t sourceCount;
  void *in_RDI;
  char **destStringPtr;
  size_t local_28;
  size_t unused;
  char16 *fileNameWide;
  
  if ((m_testHooks.pfSetAssertToConsoleFlag != (SetAssertToConsoleFlagPtr)0x0) && (m_testHooksSetup)
     ) {
    in_RDI = (void *)0x1;
    (*m_testHooks.pfSetAssertToConsoleFlag)(true);
  }
  if (m_testHooks.pfSetConfigFlags != (SetConfigFlagsPtr)0x0) {
    if (m_testHooksSetup != true) {
LAB_0010ad1e:
      if (m_usageStringPrinted != false) {
        return 0;
      }
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
      return 0;
    }
    in_RDI = (void *)(ulong)(uint)m_argInfo->argc;
    HVar1 = (*m_testHooks.pfSetConfigFlags)
                      (m_argInfo->argc,m_argInfo->argv,
                       &HostConfigFlags::flags.super_ICustomConfigFlags);
    if (HVar1 != 0) goto LAB_0010ad1e;
  }
  m_argInfo->filename = (char *)0x0;
  if (m_testHooks.pfGetFilenameFlag != (_func_HRESULT_BSTR_ptr *)0x0) {
    unused = 0;
    if ((m_testHooksSetup == true) &&
       (HVar1 = (*m_testHooks.pfGetFilenameFlag)((BSTR *)&unused), sourceString = unused, HVar1 == 0
       )) {
      destStringPtr = &m_argInfo->filename;
      sourceCount = PAL_wcslen((char16_t *)unused);
      HVar1 = utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                        (utf8::malloc_allocator::allocate,(LPCWSTR)sourceString,sourceCount,
                         destStringPtr,&local_28,(size_t *)0x0);
      in_RDI = (void *)unused;
      SysFreeString((BSTR)unused);
      if (HVar1 < 0) {
        if (HVar1 == -0x7ff8fff2) {
          PAL_wprintf(L"Error: Ran out of memory");
          return -0x7ff8fff2;
        }
        goto LAB_0010ae06;
      }
    }
    else {
      PAL_wprintf(L"Error: no script file specified.");
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
    }
    return 0;
  }
  ParseConfigFlags();
LAB_0010ae06:
  ParseConfigFlags();
  if (m_testHooksInitialized == false) {
    memcpy(&m_testHooks,in_RDI,0x2a50);
    m_testHooksSetup = true;
    m_testHooksInitialized = true;
    HVar1 = ParseConfigFlags();
    return HVar1;
  }
  return 0;
}

Assistant:

HRESULT ChakraRTInterface::ParseConfigFlags()
{
    HRESULT hr = S_OK;

    if (m_testHooks.pfSetAssertToConsoleFlag)
    {
        SetAssertToConsoleFlag(true);
    }

    if (m_testHooks.pfSetConfigFlags)
    {
        hr = SetConfigFlags(m_argInfo->argc, m_argInfo->argv, &HostConfigFlags::flags);
        if (hr != S_OK && !m_usageStringPrinted)
        {
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
    }

    if (hr == S_OK)
    {
        m_argInfo->filename = nullptr;
        Assert(m_testHooks.pfGetFilenameFlag != nullptr);

        char16* fileNameWide = nullptr;
        hr = GetFileNameFlag(&fileNameWide);

        if (hr != S_OK)
        {
            wprintf(_u("Error: no script file specified."));
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
        else
        {
            hr = WideStringToNarrowDynamic(fileNameWide, &m_argInfo->filename);
            SysFreeString(fileNameWide);
            if (FAILED(hr))
            {
                Assert(hr == E_OUTOFMEMORY);
                wprintf(_u("Error: Ran out of memory"));
                return hr;
            }
        }
    }

    return S_OK;
}